

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O1

void __thiscall
glslang::TReflection::buildUniformStageMask(TReflection *this,TIntermediate *intermediate)

{
  pointer pTVar1;
  EShLanguage EVar2;
  EShLanguageMask *pEVar3;
  uint uVar4;
  ulong uVar5;
  
  if ((this->options & EShReflectionAllBlockVariables) == EShReflectionDefault) {
    pTVar1 = (this->indexToUniform).
             super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar4 = (int)((long)(this->indexToUniform).
                        super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1 >> 4) *
            -0x33333333;
    if (0 < (int)uVar4) {
      EVar2 = intermediate->language;
      uVar5 = (ulong)(uVar4 & 0x7fffffff);
      pEVar3 = &pTVar1->stages;
      do {
        *pEVar3 = *pEVar3 | 1 << ((char)EVar2 & 0x1f);
        pEVar3 = pEVar3 + 0x14;
        uVar5 = uVar5 - 1;
      } while (uVar5 != 0);
    }
    pTVar1 = (this->indexToBufferVariable).
             super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar4 = (int)((long)(this->indexToBufferVariable).
                        super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1 >> 4) *
            -0x33333333;
    if (0 < (int)uVar4) {
      EVar2 = intermediate->language;
      uVar5 = (ulong)(uVar4 & 0x7fffffff);
      pEVar3 = &pTVar1->stages;
      do {
        *pEVar3 = *pEVar3 | 1 << ((char)EVar2 & 0x1f);
        pEVar3 = pEVar3 + 0x14;
        uVar5 = uVar5 - 1;
      } while (uVar5 != 0);
    }
  }
  return;
}

Assistant:

void TReflection::buildUniformStageMask(const TIntermediate& intermediate)
{
    if (options & EShReflectionAllBlockVariables)
        return;

    for (int i = 0; i < int(indexToUniform.size()); ++i) {
        indexToUniform[i].stages = static_cast<EShLanguageMask>(indexToUniform[i].stages | 1 << intermediate.getStage());
    }

    for (int i = 0; i < int(indexToBufferVariable.size()); ++i) {
        indexToBufferVariable[i].stages =
            static_cast<EShLanguageMask>(indexToBufferVariable[i].stages | 1 << intermediate.getStage());
    }
}